

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O0

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<__int128>::Visit
          (PrecomputeVisitor<__int128> *this,shared_ptr<const_calc4::ConditionalOperator> *op)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<const_calc4::Operator> *in_RDI;
  __int128 conditionValue;
  shared_ptr<const_calc4::Operator> ifFalse;
  shared_ptr<const_calc4::Operator> ifTrue;
  shared_ptr<const_calc4::Operator> condition;
  shared_ptr<const_calc4::ConditionalOperator> *in_stack_ffffffffffffff68;
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffff70;
  shared_ptr<const_calc4::Operator> *this_00;
  PrecomputeVisitor<__int128> *in_stack_ffffffffffffff88;
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffff90;
  PrecomputeVisitor<__int128> *in_stack_ffffffffffffff98;
  long local_60;
  shared_ptr<const_calc4::Operator> local_50 [2];
  shared_ptr<const_calc4::Operator> local_30 [3];
  
  peVar2 = std::
           __shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x141cb1);
  ConditionalOperator::GetCondition(peVar2);
  Precompute(in_stack_ffffffffffffff88,in_RDI);
  peVar2 = std::
           __shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x141cd8);
  ConditionalOperator::GetIfTrue(peVar2);
  Precompute(in_stack_ffffffffffffff88,in_RDI);
  peVar2 = std::
           __shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x141d01);
  ConditionalOperator::GetIfFalse(peVar2);
  Precompute(in_stack_ffffffffffffff88,in_RDI);
  bVar1 = TryGetPrecomputedValue
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     (__int128 *)in_stack_ffffffffffffff88);
  if (bVar1) {
    if (in_stack_ffffffffffffff98 == (PrecomputeVisitor<__int128> *)0x0 && local_60 == 0) {
      this_00 = local_50;
    }
    else {
      this_00 = local_30;
    }
    std::shared_ptr<const_calc4::Operator>::operator=
              (this_00,(shared_ptr<const_calc4::Operator> *)in_stack_ffffffffffffff68);
  }
  else {
    ConditionalOperator::Create
              ((shared_ptr<const_calc4::Operator> *)in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90,
               (shared_ptr<const_calc4::Operator> *)in_stack_ffffffffffffff88);
    std::shared_ptr<calc4::Operator_const>::operator=
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::shared_ptr<const_calc4::ConditionalOperator>::~shared_ptr
              ((shared_ptr<const_calc4::ConditionalOperator> *)0x141df4);
  }
  std::shared_ptr<const_calc4::Operator>::~shared_ptr((shared_ptr<const_calc4::Operator> *)0x141dfe)
  ;
  std::shared_ptr<const_calc4::Operator>::~shared_ptr((shared_ptr<const_calc4::Operator> *)0x141e08)
  ;
  std::shared_ptr<const_calc4::Operator>::~shared_ptr((shared_ptr<const_calc4::Operator> *)0x141e12)
  ;
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const ConditionalOperator>& op) override
    {
        std::shared_ptr<const Operator> condition = Precompute(op->GetCondition());
        std::shared_ptr<const Operator> ifTrue = Precompute(op->GetIfTrue());
        std::shared_ptr<const Operator> ifFalse = Precompute(op->GetIfFalse());

        TNumber conditionValue;
        if (TryGetPrecomputedValue(condition, &conditionValue))
        {
            value = conditionValue != 0 ? ifTrue : ifFalse;
        }
        else
        {
            value = ConditionalOperator::Create(condition, ifTrue, ifFalse);
        }
    }